

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O3

void mp::WriteModelItem(MemoryWriter *wrt,QuadAndLinTerms *qlt,ItemNamer *vnam)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  
  WriteModelItem(wrt,&qlt->super_LinTerms,vnam);
  if ((qlt->super_QuadTerms).folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      != 0) {
    if ((qlt->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
      sVar4 = pBVar2->size_;
      uVar1 = sVar4 + 3;
      if (pBVar2->capacity_ < uVar1) {
        (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
        sVar4 = pBVar2->size_;
      }
      pcVar3 = pBVar2->ptr_;
      pcVar3[sVar4 + 2] = ' ';
      pcVar3 = pcVar3 + sVar4;
      pcVar3[0] = ' ';
      pcVar3[1] = '+';
      pBVar2->size_ = uVar1;
    }
    pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
    sVar4 = pBVar2->size_;
    if (sVar4 == pBVar2->capacity_) {
      (**pBVar2->_vptr_Buffer)(pBVar2,sVar4 + 1);
      sVar4 = pBVar2->size_;
    }
    pBVar2->size_ = sVar4 + 1;
    pBVar2->ptr_[sVar4] = '(';
    WriteModelItem(wrt,&qlt->super_QuadTerms,vnam);
    pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
    sVar4 = pBVar2->size_;
    if (sVar4 == pBVar2->capacity_) {
      (**pBVar2->_vptr_Buffer)(pBVar2,sVar4 + 1);
      sVar4 = pBVar2->size_;
    }
    pBVar2->size_ = sVar4 + 1;
    pBVar2->ptr_[sVar4] = ')';
  }
  return;
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const QuadAndLinTerms& qlt,
                    ItemNamer& vnam) {
  WriteModelItem(wrt, qlt.GetLinTerms(), vnam);
  if (qlt.GetQPTerms().size()) {
    if (qlt.GetLinTerms().size())
      wrt << " + ";
    wrt << '(';
    WriteModelItem(wrt, qlt.GetQPTerms(), vnam);
    wrt << ')';
  }
}